

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

uint8_t absl::strings_internal::CordTestAccess::LengthToTag(size_t s)

{
  byte bVar1;
  uint uVar2;
  AlphaNum *in_RCX;
  string death_message;
  undefined8 local_b8;
  char *local_b0;
  string local_88;
  string local_68 [32];
  AlphaNum local_48;
  
  if (0xff3 < s) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_68,"Check s <= kMaxFlatLength failed: ",(allocator<char> *)&local_b8);
    local_b8 = 0xf;
    local_b0 = "Invalid length ";
    AlphaNum::AlphaNum(&local_48,s);
    StrCat_abi_cxx11_(&local_88,(absl *)&local_b8,&local_48,in_RCX);
    std::__cxx11::string::operator+=(local_68,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
              (3,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/cord.cc"
               ,0x622,local_68);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/cord.cc"
                  ,0x622,
                  "static uint8_t absl::strings_internal::CordTestAccess::LengthToTag(size_t)");
  }
  uVar2 = (int)s + 0xd;
  bVar1 = (char)(uVar2 >> 6) + 0x3a;
  if (s < 500) {
    bVar1 = (char)(uVar2 >> 3) + 2;
  }
  if (bVar1 < 0xf9) {
    return bVar1;
  }
  __assert_fail("tag <= MAX_FLAT_TAG",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                ,0x5e,"uint8_t absl::cord_internal::AllocatedSizeToTag(size_t)");
}

Assistant:

uint8_t CordTestAccess::LengthToTag(size_t s) {
  ABSL_INTERNAL_CHECK(s <= kMaxFlatLength, absl::StrCat("Invalid length ", s));
  return cord_internal::AllocatedSizeToTag(s + cord_internal::kFlatOverhead);
}